

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  char cVar6;
  undefined1 uVar7;
  int iVar8;
  
  iVar2 = 0;
  cVar6 = '\0';
  iVar8 = 1;
switchD_00560752_caseD_4:
  iVar3 = iVar8;
  pcVar5 = ptr;
  bVar1 = pcVar5[2];
  if (bVar1 == 0) {
    uVar7 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar5[3]);
  }
  else {
    uVar7 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 - 0xdc < 4) {
        uVar7 = 8;
      }
      else if ((bVar1 == 0xff) && (0xfd < (byte)pcVar5[3])) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0x1d;
      }
    }
  }
  ptr = pcVar5 + 2;
  iVar8 = iVar3;
  switch(uVar7) {
  case 3:
    if (iVar2 < attsMax) {
      atts[iVar2].normalized = '\0';
    }
  default:
    goto switchD_00560752_caseD_4;
  case 5:
  case 0x16:
  case 0x18:
  case 0x1d:
    if ((iVar3 == 0) && (iVar8 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
      iVar8 = 1;
    }
    goto switchD_00560752_caseD_4;
  case 6:
    if ((iVar3 == 0) && (iVar3 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
    }
    ptr = pcVar5 + 3;
    iVar8 = iVar3;
    goto switchD_00560752_caseD_4;
  case 7:
    if ((iVar3 == 0) && (iVar3 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
    }
    ptr = pcVar5 + 4;
    iVar8 = iVar3;
    goto switchD_00560752_caseD_4;
  case 9:
  case 10:
    iVar8 = 0;
    if (((iVar3 != 1) && (iVar8 = iVar3, iVar3 == 2)) && (iVar8 = 2, iVar2 < attsMax)) {
      atts[iVar2].normalized = '\0';
    }
    goto switchD_00560752_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_00560752_caseD_b;
  case 0xc:
    if (iVar3 == 2) {
      iVar8 = 2;
      if (cVar6 == '\f') {
        if (iVar2 < attsMax) {
          atts[iVar2].valueEnd = ptr;
        }
        iVar2 = iVar2 + 1;
        cVar6 = '\f';
        iVar8 = 0;
      }
      goto switchD_00560752_caseD_4;
    }
    cVar6 = '\f';
    break;
  case 0xd:
    if (iVar3 == 2) {
      iVar8 = 2;
      if (cVar6 == '\r') {
        if (iVar2 < attsMax) {
          atts[iVar2].valueEnd = ptr;
        }
        iVar2 = iVar2 + 1;
        cVar6 = '\r';
        iVar8 = 0;
      }
      goto switchD_00560752_caseD_4;
    }
    cVar6 = '\r';
    break;
  case 0x15:
    iVar8 = 0;
    if ((((iVar3 != 1) && (iVar8 = iVar3, iVar3 == 2)) && (iVar8 = 2, iVar2 < attsMax)) &&
       (atts[iVar2].normalized != '\0')) {
      if (((bVar1 == 0) && (ptr != atts[iVar2].valuePtr)) && (pcVar5[3] == ' ')) {
        bVar1 = pcVar5[4];
        if (bVar1 == 0) {
          if (pcVar5[5] == ' ') goto LAB_005609f3;
          cVar4 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar5[5]);
        }
        else {
          cVar4 = '\a';
          if (3 < bVar1 - 0xd8) {
            if (bVar1 - 0xdc < 4) {
              cVar4 = '\b';
            }
            else if ((bVar1 != 0xff) || (cVar4 = '\0', (byte)pcVar5[5] < 0xfe)) {
              cVar4 = '\x1d';
            }
          }
        }
        if (cVar4 != cVar6) goto switchD_00560752_caseD_4;
      }
LAB_005609f3:
      atts[iVar2].normalized = '\0';
    }
    goto switchD_00560752_caseD_4;
  }
  iVar8 = 2;
  if (iVar2 < attsMax) {
    atts[iVar2].valuePtr = pcVar5 + 4;
  }
  goto switchD_00560752_caseD_4;
switchD_00560752_caseD_b:
  iVar8 = 2;
  if (iVar3 != 2) {
    return iVar2;
  }
  goto switchD_00560752_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr,
                int attsMax, ATTRIBUTE *atts)
{
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define START_NAME \
      if (state == other) { \
        if (nAtts < attsMax) { \
          atts[nAtts].name = ptr; \
          atts[nAtts].normalized = 1; \
        } \
        state = inName; \
      }
#define LEAD_CASE(n) \
    case BT_LEAD ## n: START_NAME ptr += (n - MINBPC(enc)); break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      }
      else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      }
      else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue
               && nAtts < attsMax
               && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR: case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}